

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

int __thiscall Parse::argList(Parse *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pbVar3;
  pointer pcVar4;
  int iVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  key_type local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  iVar5 = expression(this);
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    this_00 = &this->paramCall;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &this->expName);
    paVar1 = &local_58.field_2;
    if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
        super__Vector_impl_data._M_start[this->curIndex].type == DELIMTER) {
      local_58.field_2._M_allocated_capacity._0_2_ = 0x2c;
      local_58._M_string_length = 1;
      local_58._M_dataplus._M_p = (pointer)paVar1;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&(this->delimiterTable->
                             super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).index,&local_58);
      iVar5 = *pmVar6;
      iVar2 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
              super__Vector_impl_data._M_start[this->curIndex].id;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT62(local_58.field_2._M_allocated_capacity._2_6_,
                                 local_58.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if (iVar5 == iVar2) {
        this->curIndex = this->curIndex + 1;
        iVar5 = argList(this);
        if (iVar5 == 0) {
          poVar7 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_33f99);
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             (poVar7,(this->tokenVec->
                                     super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                     super__Vector_impl_data._M_start[this->curIndex].line);
          poVar7 = std::operator<<(poVar7,anon_var_dwarf_33a7e);
          std::endl<char,std::char_traits<char>>(poVar7);
          exit(0);
        }
      }
    }
    __pos = (this->paramCall).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->paramCall).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__pos != pbVar3) {
      do {
        local_38 = this_00;
        pcVar4 = (__pos->_M_dataplus)._M_p;
        local_58._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar4,pcVar4 + __pos->_M_string_length);
        std::vector<QuadTuple,std::allocator<QuadTuple>>::
        emplace_back<char_const(&)[8],std::__cxx11::string&,char_const(&)[3],char_const(&)[3]>
                  ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,
                   (char (*) [8])"paramin",&local_58,(char (*) [3])"__",(char (*) [3])"__");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT62(local_58.field_2._M_allocated_capacity._2_6_,
                                   local_58.field_2._M_allocated_capacity._0_2_) + 1);
        }
        __pos = __pos + 1;
        this_00 = local_38;
      } while (__pos != pbVar3);
      __pos = (local_38->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(this_00,__pos);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int Parse::argList() {
    if(expression())  {
        paramCall.emplace_back(expName);
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[","] == tokenVec[curIndex].id) {
            curIndex++;
            if (!argList()) {
                cout << ",后没有参数定义在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
        }
        for(auto val : paramCall) {
            quadVec.emplace_back("paramin", val, "__", "__");
        }
        paramCall.clear();
        return 1;
    }
    return 0;
}